

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O3

void __thiscall
duckdb::CatalogSetSecretStorage::DropSecretByName
          (CatalogSetSecretStorage *this,string *name,OnEntryNotFound on_entry_not_found,
          optional_ptr<duckdb::CatalogTransaction,_true> transaction)

{
  pointer pcVar1;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  pointer pCVar2;
  optional_ptr<duckdb::CatalogEntry,_true> oVar3;
  ulong uVar4;
  long *plVar5;
  InvalidInputException *this_00;
  long *plVar6;
  uint uVar7;
  undefined7 in_register_00000011;
  char *pcVar8;
  string storage_string;
  string persist_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  CatalogTransaction local_80;
  CatalogTransaction local_58;
  
  uVar7 = (uint)CONCAT71(in_register_00000011,on_entry_not_found);
  pCVar2 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     (&this->secrets);
  GetTransactionOrDefault(&local_58,this,transaction);
  transaction_00.context.ptr = local_58.context.ptr;
  transaction_00.db.ptr = local_58.db.ptr;
  transaction_00.transaction.ptr = local_58.transaction.ptr;
  transaction_00.transaction_id = local_58.transaction_id;
  transaction_00.start_time = local_58.start_time;
  oVar3 = CatalogSet::GetEntry(pCVar2,transaction_00,name);
  if ((uVar7 == 0) && (oVar3.ptr == (CatalogEntry *)0x0)) {
    uVar4 = (ulong)(this->super_SecretStorage).persistent;
    pcVar8 = "temporary";
    if (uVar4 != 0) {
      pcVar8 = "persistent";
    }
    local_c0 = local_b0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,pcVar8,pcVar8 + uVar4 + 9)
    ;
    if ((this->super_SecretStorage).persistent == true) {
      ::std::operator+(&local_140," in secret storage \'",&(this->super_SecretStorage).storage_name)
      ;
      plVar5 = (long *)::std::__cxx11::string::append((char *)&local_140);
      local_120 = (long *)*plVar5;
      plVar6 = plVar5 + 2;
      if (local_120 == plVar6) {
        local_110 = *plVar6;
        lStack_108 = plVar5[3];
        local_120 = &local_110;
      }
      else {
        local_110 = *plVar6;
      }
      local_118 = plVar5[1];
      *plVar5 = (long)plVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p);
      }
    }
    else {
      local_120 = &local_110;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_120,anon_var_dwarf_63f17de + 9);
    }
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_140,"Failed to remove non-existent %s secret \'%s\'%s","");
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    ::std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_c0,local_c0 + local_b8);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar1,pcVar1 + name->_M_string_length);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_120,local_118 + (long)local_120);
    InvalidInputException::
    InvalidInputException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (this_00,&local_140,&local_a0,&local_e0,&local_100);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pCVar2 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     (&this->secrets);
  GetTransactionOrDefault(&local_80,this,transaction);
  transaction_01.context.ptr = local_80.context.ptr;
  transaction_01.db.ptr = local_80.db.ptr;
  transaction_01.transaction.ptr = local_80.transaction.ptr;
  transaction_01.transaction_id = local_80.transaction_id;
  transaction_01.start_time = local_80.start_time;
  CatalogSet::DropEntry(pCVar2,transaction_01,name,true,true);
  (*(this->super_SecretStorage)._vptr_SecretStorage[0xb])(this,name,(ulong)(uVar7 & 0xff));
  return;
}

Assistant:

void CatalogSetSecretStorage::DropSecretByName(const string &name, OnEntryNotFound on_entry_not_found,
                                               optional_ptr<CatalogTransaction> transaction) {
	auto entry = secrets->GetEntry(GetTransactionOrDefault(transaction), name);
	if (!entry && on_entry_not_found == OnEntryNotFound::THROW_EXCEPTION) {
		string persist_string = persistent ? "persistent" : "temporary";
		string storage_string = persistent ? " in secret storage '" + storage_name + "'" : "";
		throw InvalidInputException("Failed to remove non-existent %s secret '%s'%s", persist_string, name,
		                            storage_string);
	}

	secrets->DropEntry(GetTransactionOrDefault(transaction), name, true, true);
	RemoveSecret(name, on_entry_not_found);
}